

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O0

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::FocusWindowEvent,QWindow*,Qt::FocusReason>
               (QWindow *args,FocusReason args_1)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  FocusReason in_ESI;
  QWindow *in_RDI;
  long in_FS_OFFSET;
  FocusWindowEvent event;
  ProcessEventsFlag in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  WindowSystemEvent *in_stack_ffffffffffffffc8;
  byte local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = QThread::isMainThread();
  if ((uVar4 & 1) == 0) {
    QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
    handleEvent<QWindowSystemInterfacePrivate::FocusWindowEvent,QWindow*,Qt::FocusReason>
              ((QWindow *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (FocusReason)((ulong)in_RDI >> 0x20));
    QFlags<QEventLoop::ProcessEventsFlag>::QFlags
              ((QFlags<QEventLoop::ProcessEventsFlag> *)CONCAT44(in_ESI,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffac);
    bVar2 = QWindowSystemInterface::flushWindowSystemEvents((ProcessEventsFlags)args_1);
    goto LAB_0044919c;
  }
  memset(&stack0xffffffffffffffc8,0xaa,0x30);
  QWindowSystemInterfacePrivate::FocusWindowEvent::FocusWindowEvent
            ((FocusWindowEvent *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_RDI,in_ESI);
  if (QWindowSystemInterfacePrivate::eventHandler == (QWindowSystemEventHandler *)0x0) {
    QGuiApplicationPrivate::processWindowSystemEvent(in_stack_ffffffffffffffc8);
LAB_00449155:
    bVar2 = local_28 & 1;
  }
  else {
    uVar3 = (*QWindowSystemInterfacePrivate::eventHandler->_vptr_QWindowSystemEventHandler[2])
                      (QWindowSystemInterfacePrivate::eventHandler,&stack0xffffffffffffffc8);
    if ((uVar3 & 1) != 0) goto LAB_00449155;
    bVar2 = 0;
  }
  QWindowSystemInterfacePrivate::FocusWindowEvent::~FocusWindowEvent
            ((FocusWindowEvent *)CONCAT44(in_ESI,1));
LAB_0044919c:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent(Args ...args)
{
    if (QThread::isMainThread()) {
        EventType event(args...);
        // Process the event immediately on the Gui thread and return the accepted state
        if (QWindowSystemInterfacePrivate::eventHandler) {
            if (!QWindowSystemInterfacePrivate::eventHandler->sendEvent(&event))
                return false;
        } else {
            QGuiApplicationPrivate::processWindowSystemEvent(&event);
        }
        return event.eventAccepted;
    } else {
        // Post the event on the Qt main thread queue and flush the queue.
        // This will wake up the Gui thread which will process the event.
        // Return the accepted state for the last event on the queue,
        // which is the event posted by this function.
        QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
        return QWindowSystemInterface::flushWindowSystemEvents();
    }
}